

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int togglereadonlyall(int f,int n)

{
  size_t sVar1;
  buffer *pbStack_18;
  int len;
  buffer *bp;
  int n_local;
  int f_local;
  
  allbro = (int)((allbro != 0 ^ 0xffU) & 1);
  for (pbStack_18 = bheadp; pbStack_18 != (buffer *)0x0; pbStack_18 = (pbStack_18->b_list).l_p.x_bp)
  {
    sVar1 = strlen((pbStack_18->b_list).l_name);
    if ((*(pbStack_18->b_list).l_name != '*') &&
       ((pbStack_18->b_list).l_name[(int)sVar1 + -1] != '*')) {
      if (allbro == 0) {
        pbStack_18->b_flag = pbStack_18->b_flag & 0xef;
      }
      else {
        pbStack_18->b_flag = pbStack_18->b_flag | 0x10;
      }
    }
  }
  curwp->w_rflag = curwp->w_rflag | 0x10;
  return 1;
}

Assistant:

int
togglereadonlyall(int f, int n)
{
	struct buffer *bp = NULL;
	int len = 0;

	allbro = !allbro;
	for (bp = bheadp; bp != NULL; bp = bp->b_bufp) {
		len = strlen(bp->b_bname);
		if (bp->b_bname[0] != '*' && bp->b_bname[len - 1] != '*') {
			if (allbro)
				bp->b_flag |= BFREADONLY;
			else
				bp->b_flag &= ~BFREADONLY;
		}
	}
	curwp->w_rflag |= WFMODE;

	return (TRUE);
}